

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::getChunks(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *names,vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *chunks,vector<unsigned_char,_std::allocator<unsigned_char>_> *png)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  const_reference pvVar5;
  long lVar6;
  long in_RSI;
  string name;
  char type [5];
  int location;
  uchar *end;
  uchar *begin;
  uchar *next;
  uchar *chunk;
  value_type *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  value_type *in_stack_ffffffffffffff18;
  allocator<char> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff38;
  allocator<char> *in_stack_ffffffffffffff40;
  uchar *__first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  int local_88;
  undefined1 local_71 [40];
  uchar local_49 [5];
  int local_44;
  allocator<char> *local_40;
  allocator<char> *local_38;
  allocator<char> *local_30;
  allocator<char> *local_28;
  long local_18;
  uint local_4;
  
  local_18 = in_RSI;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_40 = (allocator<char> *)(pvVar5 + 1);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_38 = (allocator<char> *)(pvVar5 + 8);
  local_44 = 0;
  local_28 = local_38;
  do {
    if (local_40 <= local_28 + 8 || local_28 < local_38) {
      return 0;
    }
    __first = local_49;
    lodepng_chunk_type((char *)__first,(uchar *)local_28);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)__first,in_stack_ffffffffffffff40);
    std::allocator<char>::~allocator((allocator<char> *)local_71);
    lVar6 = std::__cxx11::string::size();
    if (lVar6 == 4) {
      in_stack_ffffffffffffff40 =
           (allocator<char> *)lodepng_chunk_next_const((uchar *)in_stack_ffffffffffffff08);
      local_30 = in_stack_ffffffffffffff40;
      if (local_28 < in_stack_ffffffffffffff40) {
        uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                (char *)in_stack_ffffffffffffff08);
        if ((bool)uVar1) {
          local_44 = 0;
        }
        else {
          uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                  (char *)in_stack_ffffffffffffff08);
          if ((bool)uVar2) {
            local_44 = 1;
          }
          else {
            uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                                    ,(char *)in_stack_ffffffffffffff08);
            if (!(bool)uVar3) {
              uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_ffffffffffffff14,
                                                  in_stack_ffffffffffffff10),
                                      (char *)in_stack_ffffffffffffff08);
              if ((bool)uVar4) {
                local_88 = 3;
              }
              else {
                if (local_30 <= local_40) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
                  in_stack_ffffffffffffff18 = (value_type *)(local_18 + (long)local_44 * 0x18);
                  in_stack_ffffffffffffff20 = local_28;
                  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x13e503);
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  vector<unsigned_char_const*,void>
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,__first,
                             (uchar *)in_stack_ffffffffffffff40,
                             (allocator_type *)
                             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  in_stack_ffffffffffffff38)))));
                  std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              in_stack_ffffffffffffff08);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             in_stack_ffffffffffffff20);
                  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x13e543);
                  goto LAB_0013e57f;
                }
                local_4 = 1;
                local_88 = 1;
              }
              goto LAB_0013e597;
            }
            local_44 = 2;
          }
        }
LAB_0013e57f:
        local_28 = local_30;
        local_88 = 0;
      }
      else {
        local_4 = 1;
        local_88 = 1;
      }
    }
    else {
      local_4 = 1;
      local_88 = 1;
    }
LAB_0013e597:
    std::__cxx11::string::~string((string *)(local_71 + 1));
    if (local_88 != 0) {
      if (local_88 != 1) {
        return 0;
      }
      return local_4;
    }
    in_stack_ffffffffffffff14 = 0;
  } while( true );
}

Assistant:

unsigned getChunks(std::vector<std::string> names[3],
                   std::vector<std::vector<unsigned char> > chunks[3],
                   const std::vector<unsigned char>& png) {
  const unsigned char *chunk, *next, *begin, *end;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  int location = 0;

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    std::string name(type);
    if(name.size() != 4) return 1;

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) return 1; // integer overflow

    if(name == "IHDR") {
      location = 0;
    } else if(name == "PLTE") {
      location = 1;
    } else if(name == "IDAT") {
      location = 2;
    } else if(name == "IEND") {
      break; // anything after IEND is not part of the PNG or the 3 groups here.
    } else {
      if(next > end) return 1; // invalid chunk, content too far
      names[location].push_back(name);
      chunks[location].push_back(std::vector<unsigned char>(chunk, next));
    }

    chunk = next;
  }
  return 0;
}